

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool google::ParseOperatorName(State *state)

{
  bool bVar1;
  undefined **local_50;
  AbbrevPair *p;
  State copy;
  State *state_local;
  
  copy._40_8_ = state;
  bVar1 = AtLeastNumCharsRemaining(state->mangled_cur,2);
  if (bVar1) {
    memcpy(&p,(void *)copy._40_8_,0x30);
    bVar1 = ParseTwoCharToken((State *)copy._40_8_,"cv");
    if ((((bVar1) && (bVar1 = MaybeAppend((State *)copy._40_8_,"operator "), bVar1)) &&
        (bVar1 = EnterNestedName((State *)copy._40_8_), bVar1)) &&
       ((bVar1 = ParseType((State *)copy._40_8_), bVar1 &&
        (bVar1 = LeaveNestedName((State *)copy._40_8_,copy.prev_name._4_2_), bVar1)))) {
      state_local._7_1_ = true;
    }
    else {
      memcpy((void *)copy._40_8_,&p,0x30);
      bVar1 = ParseOneCharToken((State *)copy._40_8_,'v');
      if ((bVar1) &&
         ((bVar1 = ParseCharClass((State *)copy._40_8_,"0123456789"), bVar1 &&
          (bVar1 = ParseSourceName((State *)copy._40_8_), bVar1)))) {
        state_local._7_1_ = true;
      }
      else {
        memcpy((void *)copy._40_8_,&p,0x30);
        bVar1 = IsLower(**(char **)copy._40_8_);
        if ((bVar1) && (bVar1 = IsAlpha(*(char *)(*(long *)copy._40_8_ + 1)), bVar1)) {
          for (local_50 = &kOperatorList; *local_50 != (undefined *)0x0; local_50 = local_50 + 2) {
            if ((**(char **)copy._40_8_ == **local_50) &&
               (*(char *)(*(long *)copy._40_8_ + 1) == (*local_50)[1])) {
              MaybeAppend((State *)copy._40_8_,"operator");
              bVar1 = IsLower(*local_50[1]);
              if (bVar1) {
                MaybeAppend((State *)copy._40_8_," ");
              }
              MaybeAppend((State *)copy._40_8_,local_50[1]);
              *(long *)copy._40_8_ = *(long *)copy._40_8_ + 2;
              return true;
            }
          }
          state_local._7_1_ = false;
        }
        else {
          state_local._7_1_ = false;
        }
      }
    }
  }
  else {
    state_local._7_1_ = false;
  }
  return state_local._7_1_;
}

Assistant:

static bool ParseOperatorName(State *state) {
  if (!AtLeastNumCharsRemaining(state->mangled_cur, 2)) {
    return false;
  }
  // First check with "cv" (cast) case.
  State copy = *state;
  if (ParseTwoCharToken(state, "cv") &&
      MaybeAppend(state, "operator ") &&
      EnterNestedName(state) &&
      ParseType(state) &&
      LeaveNestedName(state, copy.nest_level)) {
    return true;
  }
  *state = copy;

  // Then vendor extended operators.
  if (ParseOneCharToken(state, 'v') && ParseCharClass(state, "0123456789") &&
      ParseSourceName(state)) {
    return true;
  }
  *state = copy;

  // Other operator names should start with a lower alphabet followed
  // by a lower/upper alphabet.
  if (!(IsLower(state->mangled_cur[0]) &&
        IsAlpha(state->mangled_cur[1]))) {
    return false;
  }
  // We may want to perform a binary search if we really need speed.
  const AbbrevPair *p;
  for (p = kOperatorList; p->abbrev != NULL; ++p) {
    if (state->mangled_cur[0] == p->abbrev[0] &&
        state->mangled_cur[1] == p->abbrev[1]) {
      MaybeAppend(state, "operator");
      if (IsLower(*p->real_name)) {  // new, delete, etc.
        MaybeAppend(state, " ");
      }
      MaybeAppend(state, p->real_name);
      state->mangled_cur += 2;
      return true;
    }
  }
  return false;
}